

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall kj::Vector<bool>::setCapacity(Vector<bool> *this,size_t newSize)

{
  bool *pbVar1;
  bool *pbVar2;
  RemoveConst<bool> *pRVar3;
  bool *__dest;
  size_t __n;
  ArrayBuilder<bool> newBuilder;
  ArrayBuilder<bool> local_38;
  
  pbVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)pbVar1)) {
    (this->builder).pos = pbVar1 + newSize;
  }
  __dest = (bool *)kj::_::HeapArrayDisposer::allocateImpl
                             (1,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = __dest + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pbVar1 = (this->builder).ptr;
  pbVar2 = (this->builder).pos;
  local_38.ptr = __dest;
  if (pbVar1 != pbVar2) {
    __n = (long)pbVar2 - (long)pbVar1;
    local_38.pos = __dest;
    memcpy(__dest,pbVar1,__n);
    __dest = __dest + __n;
  }
  local_38.pos = __dest;
  ArrayBuilder<bool>::operator=(&this->builder,&local_38);
  pbVar2 = local_38.endPtr;
  pRVar3 = local_38.pos;
  pbVar1 = local_38.ptr;
  if (local_38.ptr != (bool *)0x0) {
    local_38.ptr = (bool *)0x0;
    local_38.pos = (RemoveConst<bool> *)0x0;
    local_38.endPtr = (bool *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pbVar1,1,(long)pRVar3 - (long)pbVar1,(long)pbVar2 - (long)pbVar1,0)
    ;
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }